

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O1

void duckdb::ConstantVector::Reference(Vector *vector,Vector *source,idx_t position,idx_t count)

{
  LogicalType *other;
  PhysicalType PVar1;
  data_ptr_t pdVar2;
  unsigned_long *puVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  Vector *pVVar6;
  Vector *pVVar7;
  idx_t iVar8;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  reference pvVar9;
  type vector_00;
  type source_00;
  long lVar10;
  ulong uVar11;
  size_type __n;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Value value;
  SelectionVector sel;
  UnifiedVectorFormat local_100;
  Value local_b8;
  LogicalType local_78;
  LogicalType local_60;
  LogicalType local_48;
  
  other = &source->type;
  PVar1 = (source->type).physical_type_;
  if (PVar1 == ARRAY) {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_100);
    Vector::ToUnifiedFormat(source,count,&local_100);
    if ((local_100.sel)->sel_vector != (sel_t *)0x0) {
      position = (idx_t)(local_100.sel)->sel_vector[position];
    }
    if ((local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[position >> 6]
         >> (position & 0x3f) & 1) != 0)) {
      pVVar6 = ArrayVector::GetEntryInternal<duckdb::Vector>(vector);
      pVVar7 = ArrayVector::GetEntryInternal<duckdb::Vector>(source);
      Vector::Reference(pVVar6,pVVar7);
      iVar8 = ArrayType::GetSize(other);
      SelectionVector::SelectionVector((SelectionVector *)&local_b8,iVar8);
      auVar5 = _DAT_01defe80;
      if (iVar8 != 0) {
        iVar12 = (int)position * (int)iVar8;
        lVar10 = iVar8 - 1;
        auVar13._8_4_ = (int)lVar10;
        auVar13._0_8_ = lVar10;
        auVar13._12_4_ = (int)((ulong)lVar10 >> 0x20);
        uVar11 = 0;
        auVar13 = auVar13 ^ _DAT_01defe80;
        auVar14 = _DAT_01df8070;
        do {
          auVar15 = auVar14 ^ auVar5;
          if ((bool)(~(auVar15._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar15._0_4_ ||
                      auVar13._4_4_ < auVar15._4_4_) & 1)) {
            *(int *)(local_b8.type_._0_8_ + uVar11 * 4) = iVar12;
          }
          if ((auVar15._12_4_ != auVar13._12_4_ || auVar15._8_4_ <= auVar13._8_4_) &&
              auVar15._12_4_ <= auVar13._12_4_) {
            *(int *)(local_b8.type_._0_8_ + (uVar11 + 1) * 4) = iVar12 + 1;
          }
          uVar11 = uVar11 + 2;
          lVar10 = auVar14._8_8_;
          auVar14._0_8_ = auVar14._0_8_ + 2;
          auVar14._8_8_ = lVar10 + 2;
          iVar12 = iVar12 + 2;
        } while ((iVar8 + 1 & 0xfffffffffffffffe) != uVar11);
      }
      Vector::Slice(pVVar6,(SelectionVector *)&local_b8,iVar8);
      Vector::Flatten(pVVar6,iVar8);
      Vector::SetVectorType(vector,CONSTANT_VECTOR);
      puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar3 != (unsigned_long *)0x0) {
        *(byte *)puVar3 = (byte)*puVar3 | 1;
      }
      if (local_b8.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      goto LAB_00ddc1b8;
    }
    LogicalType::LogicalType(&local_60,other);
    Value::Value(&local_b8,&local_60);
    LogicalType::~LogicalType(&local_60);
    Vector::Reference(vector,&local_b8);
  }
  else if (PVar1 == STRUCT) {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_100);
    Vector::ToUnifiedFormat(source,count,&local_100);
    iVar8 = position;
    if ((local_100.sel)->sel_vector != (sel_t *)0x0) {
      iVar8 = (idx_t)(local_100.sel)->sel_vector[position];
    }
    if ((local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar8 >> 6] >>
         (iVar8 & 0x3f) & 1) != 0)) {
      this = StructVector::GetEntries(source);
      this_00 = StructVector::GetEntries(vector);
      if ((this->
          super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->
          super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        __n = 0;
        do {
          pvVar9 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                   ::operator[](this_00,__n);
          vector_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(pvVar9);
          pvVar9 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                   ::operator[](this,__n);
          source_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(pvVar9);
          Reference(vector_00,source_00,position,count);
          __n = __n + 1;
        } while (__n < (ulong)((long)(this->
                                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ).
                                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->
                                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ).
                                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      Vector::SetVectorType(vector,CONSTANT_VECTOR);
      puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar3 != (unsigned_long *)0x0) {
        *(byte *)puVar3 = (byte)*puVar3 | 1;
      }
      goto LAB_00ddc1b8;
    }
    LogicalType::LogicalType(&local_78,other);
    Value::Value(&local_b8,&local_78);
    LogicalType::~LogicalType(&local_78);
    Vector::Reference(vector,&local_b8);
  }
  else {
    if (PVar1 != LIST) {
      Vector::GetValue((Value *)&local_100,source,position);
      Vector::Reference(vector,(Value *)&local_100);
      Value::~Value((Value *)&local_100);
      return;
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&local_100);
    Vector::ToUnifiedFormat(source,count,&local_100);
    if ((local_100.sel)->sel_vector != (sel_t *)0x0) {
      position = (idx_t)(local_100.sel)->sel_vector[position];
    }
    if ((local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[position >> 6]
         >> (position & 0x3f) & 1) != 0)) {
      pdVar2 = vector->data;
      uVar4 = *(undefined8 *)(local_100.data + position * 0x10 + 8);
      *(undefined8 *)pdVar2 = *(undefined8 *)(local_100.data + position * 0x10);
      *(undefined8 *)(pdVar2 + 8) = uVar4;
      pVVar6 = ListVector::GetEntryInternal<duckdb::Vector>(vector);
      pVVar7 = ListVector::GetEntryInternal<duckdb::Vector>(source);
      Vector::Reference(pVVar6,pVVar7);
      iVar8 = ListVector::GetListSize(source);
      ListVector::SetListSize(vector,iVar8);
      Vector::SetVectorType(vector,CONSTANT_VECTOR);
      goto LAB_00ddc1b8;
    }
    LogicalType::LogicalType(&local_48,other);
    Value::Value(&local_b8,&local_48);
    LogicalType::~LogicalType(&local_48);
    Vector::Reference(vector,&local_b8);
  }
  Value::~Value(&local_b8);
LAB_00ddc1b8:
  if (local_100.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ConstantVector::Reference(Vector &vector, Vector &source, idx_t position, idx_t count) {
	auto &source_type = source.GetType();
	switch (source_type.InternalType()) {
	case PhysicalType::LIST: {
		// retrieve the list entry from the source vector
		UnifiedVectorFormat vdata;
		source.ToUnifiedFormat(count, vdata);

		auto list_index = vdata.sel->get_index(position);
		if (!vdata.validity.RowIsValid(list_index)) {
			// list is null: create null value
			Value null_value(source_type);
			vector.Reference(null_value);
			break;
		}

		auto list_data = UnifiedVectorFormat::GetData<list_entry_t>(vdata);
		auto list_entry = list_data[list_index];

		// add the list entry as the first element of "vector"
		// FIXME: we only need to allocate space for 1 tuple here
		auto target_data = FlatVector::GetData<list_entry_t>(vector);
		target_data[0] = list_entry;

		// create a reference to the child list of the source vector
		auto &child = ListVector::GetEntry(vector);
		child.Reference(ListVector::GetEntry(source));

		ListVector::SetListSize(vector, ListVector::GetListSize(source));
		vector.SetVectorType(VectorType::CONSTANT_VECTOR);
		break;
	}
	case PhysicalType::ARRAY: {
		UnifiedVectorFormat vdata;
		source.ToUnifiedFormat(count, vdata);
		auto source_idx = vdata.sel->get_index(position);
		if (!vdata.validity.RowIsValid(source_idx)) {
			// list is null: create null value
			Value null_value(source_type);
			vector.Reference(null_value);
			break;
		}

		// Reference the child vector
		auto &target_child = ArrayVector::GetEntry(vector);
		auto &source_child = ArrayVector::GetEntry(source);
		target_child.Reference(source_child);

		// Only take the element at the given position
		auto array_size = ArrayType::GetSize(source_type);
		SelectionVector sel(array_size);
		for (idx_t i = 0; i < array_size; i++) {
			sel.set_index(i, array_size * source_idx + i);
		}
		target_child.Slice(sel, array_size);
		target_child.Flatten(array_size); // since its constant we only have to flatten this much

		vector.SetVectorType(VectorType::CONSTANT_VECTOR);
		vector.validity.Set(0, true);
		break;
	}
	case PhysicalType::STRUCT: {
		UnifiedVectorFormat vdata;
		source.ToUnifiedFormat(count, vdata);

		auto struct_index = vdata.sel->get_index(position);
		if (!vdata.validity.RowIsValid(struct_index)) {
			// null struct: create null value
			Value null_value(source_type);
			vector.Reference(null_value);
			break;
		}

		// struct: pass constant reference into child entries
		auto &source_entries = StructVector::GetEntries(source);
		auto &target_entries = StructVector::GetEntries(vector);
		for (idx_t i = 0; i < source_entries.size(); i++) {
			ConstantVector::Reference(*target_entries[i], *source_entries[i], position, count);
		}
		vector.SetVectorType(VectorType::CONSTANT_VECTOR);
		vector.validity.Set(0, true);
		break;
	}
	default:
		// default behavior: get a value from the vector and reference it
		// this is not that expensive for scalar types
		auto value = source.GetValue(position);
		vector.Reference(value);
		D_ASSERT(vector.GetVectorType() == VectorType::CONSTANT_VECTOR);
		break;
	}
}